

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocatedInternal<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (void *this,Type *value)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  if ((*this == (Arena *)0x0) && (piVar3 = *(int **)((long)this + 0x10), piVar3 != (int *)0x0)) {
    iVar1 = *piVar3;
    if (iVar1 < *(int *)((long)this + 0xc)) {
      iVar2 = *(int *)((long)this + 8);
      if (iVar2 < iVar1) {
        *(undefined8 *)(piVar3 + (long)iVar1 * 2 + 2) =
             *(undefined8 *)(piVar3 + (long)iVar2 * 2 + 2);
      }
      *(Type **)(piVar3 + (long)iVar2 * 2 + 2) = value;
      *(int *)((long)this + 8) = iVar2 + 1;
      **(int **)((long)this + 0x10) = **(int **)((long)this + 0x10) + 1;
      return;
    }
  }
  AddAllocatedSlowWithCopy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            ((RepeatedPtrFieldBase *)this,value,(Arena *)0x0,*this);
  return;
}

Assistant:

inline Arena* GetArenaNoVirtual() const {
    return arena_;
  }